

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  _Alloc_hider _Var5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  string input;
  string key;
  string output;
  string enc_dec;
  string s;
  allocator<char> local_191;
  undefined1 *local_190;
  long local_188;
  undefined1 local_180;
  undefined7 uStack_17f;
  long *local_170;
  long local_168;
  long local_160 [2];
  undefined1 *local_150;
  char *local_148;
  undefined1 local_140;
  undefined7 uStack_13f;
  long *local_130 [2];
  long local_120 [2];
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  if (argc < 5) {
    usage();
    return 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_130,argv[1],(allocator<char> *)&local_170);
  iVar3 = std::__cxx11::string::compare((char *)local_130);
  if ((iVar3 != 0) && (iVar3 = std::__cxx11::string::compare((char *)local_130), iVar3 != 0)) {
    iVar3 = 2;
    usage();
    goto LAB_001031e1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,argv[2],(allocator<char> *)&local_190);
  if (local_168 == 8) {
    local_190 = &local_180;
    local_188 = 0;
    local_180 = 0;
    local_148 = (char *)0x0;
    local_140 = 0;
    pcVar1 = argv[3];
    local_150 = &local_140;
    strlen(pcVar1);
    std::__cxx11::string::_M_replace((ulong)&local_190,0,(char *)0x0,(ulong)pcVar1);
    pcVar2 = local_148;
    pcVar1 = argv[4];
    strlen(pcVar1);
    std::__cxx11::string::_M_replace((ulong)&local_150,0,pcVar2,(ulong)pcVar1);
    if (argc != 5) {
      std::__cxx11::string::string<std::allocator<char>>((string *)local_50,argv[5],&local_191);
      iVar3 = std::__cxx11::string::compare((char *)local_50);
      if (iVar3 == 0) {
        s_showMessage = 1;
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
    }
    iVar3 = std::__cxx11::string::compare((char *)local_130);
    if (iVar3 == 0) {
      paVar6 = &local_70.field_2;
      local_70._M_dataplus._M_p = (pointer)paVar6;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,local_170,local_168 + (long)local_170);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_190,local_190 + local_188)
      ;
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,local_150,local_148 + (long)local_150);
      iVar3 = encrypt_decrypt(&local_70,&local_b0,&local_d0,0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      _Var5._M_p = local_70._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        _Var5._M_p = local_70._M_dataplus._M_p;
      }
LAB_00103183:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var5._M_p != paVar6) {
        operator_delete(_Var5._M_p,paVar6->_M_allocated_capacity + 1);
      }
    }
    else {
      iVar4 = std::__cxx11::string::compare((char *)local_130);
      iVar3 = 0;
      if (iVar4 == 0) {
        paVar6 = &local_90.field_2;
        local_90._M_dataplus._M_p = (pointer)paVar6;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,local_170,local_168 + (long)local_170);
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f0,local_190,local_190 + local_188);
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_110,local_150,local_148 + (long)local_150);
        iVar3 = encrypt_decrypt(&local_90,&local_f0,&local_110,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != &local_110.field_2) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        _Var5._M_p = local_90._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          _Var5._M_p = local_90._M_dataplus._M_p;
        }
        goto LAB_00103183;
      }
    }
    if (local_150 != &local_140) {
      operator_delete(local_150,CONCAT71(uStack_13f,local_140) + 1);
    }
    if (local_190 != &local_180) {
      operator_delete(local_190,CONCAT71(uStack_17f,local_180) + 1);
    }
  }
  else {
    iVar3 = 2;
    usage();
  }
  if (local_170 != local_160) {
    operator_delete(local_170,local_160[0] + 1);
  }
LAB_001031e1:
  if (local_130[0] != local_120) {
    operator_delete(local_130[0],local_120[0] + 1);
  }
  return iVar3;
}

Assistant:

int main(int argc, char **argv)
{

	if (argc < 5)
	{
		usage();
		return 1;
	}

	string enc_dec = argv[1];
	if (enc_dec != "-e" && enc_dec != "-d")
	{
		usage();
		return 2;
	}

	string key = argv[2];
	if (key.size() != 8)
	{
		usage();
		return 2;
	}

	string input, output;
	if (argc > 3)
		input = argv[3];
	if (argc > 4)
		output = argv[4];

	if (argc > 5)
	{
		string s = argv[5];
		if (s == "-s")
			s_showMessage = false;
	}


	assert(sizeof(uint64_t) == 8);

	//    string key = "8654321";
	//    string enc_dec = "-e";
	//    string input = "E:\\MyGitRepo\\myDES\\pgAdmin3.7z";
	//    string output = "E:\\MyGitRepo\\myDES\\pgAdmin3.7z.des";
	//    string enc_dec = "-d";
	//    string input = "E:\\MyGitRepo\\myDES\\pgAdmin3.7z.des";
	//    string output = "E:\\MyGitRepo\\myDES\\pgAdmin3.7z.des.7z";

	if (enc_dec == "-e")
		return encrypt_decrypt(key, input, output, 0);
	if (enc_dec == "-d")
		return encrypt_decrypt(key, input, output, 1);

	return 0;
}